

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

cf_void_t cf_list_insert_after(cf_list_t *self,cf_list_iter_t iter,void *data)

{
  cf_list_node *pcVar1;
  cf_list_node_t *node;
  void *data_local;
  cf_list_iter_t iter_local;
  cf_list_t *self_local;
  
  pcVar1 = (cf_list_node *)
           cf_malloc_dbg(0x18,1,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/src/cf/list.c"
                         ,"cf_list_insert_after",0x31);
  pcVar1->data = data;
  pcVar1->prev = iter;
  pcVar1->next = iter->next;
  iter->next->prev = pcVar1;
  iter->next = pcVar1;
  self->data = (cf_void_t *)((long)self->data + 1);
  return;
}

Assistant:

cf_void_t cf_list_insert_after(cf_list_t* self, cf_list_iter_t iter, void* data) {
    cf_list_node_t* node = CF_NULL_PTR;

    /* iter[next] -> node[prev+next] -> next[prev] */
    node = (cf_list_node_t*)cf_malloc_z(sizeof(cf_list_node_t));
    node->data = data;
    node->prev = iter;
    node->next = iter->next;
    iter->next->prev = node;
    iter->next = node;

    self->data = CF_TYPE_CAST(cf_void_t*, CF_TYPE_CAST(cf_uintptr_t, self->data) + 1);
}